

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::
DescriptorTest_PrintableNameIsFullNameForNonExtensionFields_Test::
DescriptorTest_PrintableNameIsFullNameForNonExtensionFields_Test
          (DescriptorTest_PrintableNameIsFullNameForNonExtensionFields_Test *this)

{
  DescriptorTest_PrintableNameIsFullNameForNonExtensionFields_Test *this_local;
  
  DescriptorTest::DescriptorTest(&this->super_DescriptorTest);
  (this->super_DescriptorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DescriptorTest_PrintableNameIsFullNameForNonExtensionFields_Test_029a5a40
  ;
  return;
}

Assistant:

TEST_F(DescriptorTest, PrintableNameIsFullNameForNonExtensionFields) {
  EXPECT_EQ("TestMessage.foo", foo_->PrintableNameForExtension());
  EXPECT_EQ("TestMessage.bar", bar_->PrintableNameForExtension());
  EXPECT_EQ("TestMessage.baz", baz_->PrintableNameForExtension());
  EXPECT_EQ("TestMessage.moo", moo_->PrintableNameForExtension());

  EXPECT_EQ("corge.grault.TestMessage2.foo",
            foo2_->PrintableNameForExtension());
  EXPECT_EQ("corge.grault.TestMessage2.bar",
            bar2_->PrintableNameForExtension());
  EXPECT_EQ("corge.grault.TestMessage2.mooo",
            mooo2_->PrintableNameForExtension());
}